

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

asn_enc_rval_t *
OCTET_STRING_encode_xer_utf8
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  size_t sVar9;
  
  if (sptr == (void *)0x0) {
LAB_001479ee:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  else {
    pbVar5 = *sptr;
    lVar3 = (long)*(int *)((long)sptr + 8);
    if (pbVar5 == (byte *)0x0) {
      if (*(int *)((long)sptr + 8) != 0) goto LAB_001479ee;
      lVar3 = 0;
    }
    pbVar4 = pbVar5 + lVar3;
    pbVar8 = (byte *)0x0;
    pbVar6 = pbVar5;
    for (pbVar7 = pbVar5; pbVar7 < pbVar4; pbVar7 = pbVar7 + 1) {
      bVar1 = *pbVar7;
      if (bVar1 < 0x3f) {
        sVar9 = (size_t)OCTET_STRING__xer_escape_table[bVar1].size;
        if (sVar9 != 0) {
          if (((pbVar7 != pbVar6) &&
              (iVar2 = (*cb)(pbVar6,(long)pbVar5 - (long)pbVar6,app_key), iVar2 < 0)) ||
             (iVar2 = (*cb)(OCTET_STRING__xer_escape_table[bVar1].string,sVar9,app_key), iVar2 < 0))
          goto LAB_001479fc;
          pbVar8 = pbVar5 + (long)(pbVar8 + (sVar9 - (long)pbVar6));
          pbVar6 = pbVar7 + 1;
        }
      }
      pbVar5 = pbVar5 + 1;
    }
    if ((pbVar7 == pbVar6) ||
       (iVar2 = (*cb)(pbVar6,(long)pbVar5 - (long)pbVar6,app_key), -1 < iVar2)) {
      __return_storage_ptr__->encoded = (ssize_t)(pbVar8 + ((long)pbVar5 - (long)pbVar6));
      __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
      __return_storage_ptr__->structure_ptr = (void *)0x0;
    }
    else {
LAB_001479fc:
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer_utf8(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	uint8_t *buf, *end;
	uint8_t *ss;	/* Sequence start */
	ssize_t encoded_len = 0;

	(void)ilevel;	/* Unused argument */
	(void)flags;	/* Unused argument */

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	buf = st->buf;
	end = buf + st->size;
	for(ss = buf; buf < end; buf++) {
		unsigned int ch = *buf;
		int s_len;	/* Special encoding sequence length */

		/*
		 * Escape certain characters: X.680/11.15
		 */
		if(ch < sizeof(OCTET_STRING__xer_escape_table)
			/sizeof(OCTET_STRING__xer_escape_table[0])
		&& (s_len = OCTET_STRING__xer_escape_table[ch].size)) {
			if(((buf - ss) && cb(ss, buf - ss, app_key) < 0)
			|| cb(OCTET_STRING__xer_escape_table[ch].string, s_len,
					app_key) < 0)
				ASN__ENCODE_FAILED;
			encoded_len += (buf - ss) + s_len;
			ss = buf + 1;
		}
	}

	encoded_len += (buf - ss);
	if((buf - ss) && cb(ss, buf - ss, app_key) < 0)
		ASN__ENCODE_FAILED;

	er.encoded = encoded_len;
	ASN__ENCODED_OK(er);
}